

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O3

void __thiscall options::options(options *this,uint argc,char **argv)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  allocator local_62;
  allocator local_61;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  this->valid = true;
  if (argc == 3) {
    lVar2 = atol(argv[1]);
    this->Lx = (uint)lVar2;
    lVar2 = atol(argv[2]);
    this->Ly = (uint)lVar2;
    return;
  }
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_60,argv[1],&local_61);
    iVar1 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar1 == 0) {
      bVar3 = true;
    }
    else {
      std::__cxx11::string::string((string *)local_40,argv[1],&local_62);
      iVar1 = std::__cxx11::string::compare((char *)local_40);
      bVar3 = iVar1 == 0;
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      lVar2 = atol(argv[1]);
      this->Ly = (uint)lVar2;
      this->Lx = (uint)lVar2;
      return;
    }
    help_abi_cxx11_(&local_60,this,*argv);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
  else {
    help_abi_cxx11_(&local_60,this,*argv);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
  operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

options(unsigned argc, char *argv[]) : valid(true) {
    switch (argc) {
    case 2:
      if (std::string(argv[1]) == "-h" || std::string(argv[1]) == "--help")
        std::cerr << help(argv[0]);
      else
        Lx = Ly = std::atol(argv[1]);
      return;
    case 3:
      Lx = std::atol(argv[1]);
      Ly = std::atol(argv[2]);
      return;
    default:
      std::cerr << help(argv[0]);
      return;
    }
  }